

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O3

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test::TestBody
          (Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test *this)

{
  pointer pcVar1;
  pointer paVar2;
  bool bVar3;
  secp256k1_context_struct *context;
  pointer __x;
  ByteData actual;
  Secp256k1 secp;
  CombinePubkeyTestVector test_vector;
  AssertHelper local_90;
  ByteData local_88;
  Secp256k1 local_70;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&local_70,context);
  paVar2 = combine_error_vectors.
           super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (combine_error_vectors.
      super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      combine_error_vectors.
      super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __x = combine_error_vectors.
          super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_68,&__x->pubkeys);
      local_50[0] = local_40;
      pcVar1 = (__x->expect)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + (__x->expect)._M_string_length);
      bVar3 = testing::internal::AlwaysTrue();
      if ((bVar3) &&
         (cfd::core::Secp256k1::CombinePubkeySecp256k1Ec(&local_88,&local_70,&local_68),
         (long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        operator_delete(local_88.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      testing::Message::Message((Message *)&local_88);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x9c,
                 "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys) throws an exception of type CfdException.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((((long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != (long *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         ((long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_88.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_68);
      __x = __x + 1;
    } while (__x != paVar2);
  }
  return;
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcErrorCaseTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_error_vectors) {
    EXPECT_THROW(
        ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys),
        CfdException);
  }
}